

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O0

char * ScanUintUint(FILE *out,uint *a,uint *b)

{
  int iVar1;
  int status;
  uint *b_local;
  uint *a_local;
  FILE *out_local;
  
  iVar1 = __isoc99_fscanf(out,"%u%u",a,b);
  if (iVar1 < 0) {
    PrintWithoutBuffering("output too short -- ");
    out_local = (FILE *)Fail;
  }
  else if (iVar1 < 2) {
    PrintWithoutBuffering("bad output format -- ");
    out_local = (FILE *)Fail;
  }
  else {
    out_local = (FILE *)Pass;
  }
  return (char *)out_local;
}

Assistant:

const char* ScanUintUint(FILE* out, unsigned* a, unsigned* b) {
    int status = fscanf(out, "%u%u", a, b);
    if (status < 0) {
        PrintWithoutBuffering("output too short -- ");
        return Fail;
    } else if (status < 2) {
        PrintWithoutBuffering("bad output format -- ");
        return Fail;
    }
    return Pass;
}